

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionTest_ListFieldsOneOf_Test::TestBody
          (GeneratedMessageReflectionTest_ListFieldsOneOf_Test *this)

{
  bool bVar1;
  Reflection *this_00;
  char *message_00;
  AssertHelper local_b0;
  Message local_a8;
  size_type local_a0;
  int local_94;
  undefined1 local_90 [8];
  AssertionResult gtest_ar;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  Reflection *reflection;
  undefined1 local_50 [8];
  TestOneof2 message;
  GeneratedMessageReflectionTest_ListFieldsOneOf_Test *this_local;
  
  message.field_0._impl_._oneof_case_ = (uint32_t  [2])this;
  proto2_unittest::TestOneof2::TestOneof2((TestOneof2 *)local_50);
  TestUtil::SetOneof1<proto2_unittest::TestOneof2>((TestOneof2 *)local_50);
  this_00 = proto2_unittest::TestOneof2::GetReflection();
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)&gtest_ar.message_);
  Reflection::ListFields
            (this_00,(Message *)local_50,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)&gtest_ar.message_);
  local_94 = 4;
  local_a0 = std::
             vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ::size((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     *)&gtest_ar.message_);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_90,"4","fields.size()",&local_94,&local_a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    message_00 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x445,message_00);
    testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)&gtest_ar.message_);
  proto2_unittest::TestOneof2::~TestOneof2((TestOneof2 *)local_50);
  return;
}

Assistant:

TEST(GeneratedMessageReflectionTest, ListFieldsOneOf) {
  unittest::TestOneof2 message;
  TestUtil::SetOneof1(&message);

  const Reflection* reflection = message.GetReflection();
  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(message, &fields);
  EXPECT_EQ(4, fields.size());
}